

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O0

void HUF_fillDTableX2(HUF_DEltX2 *DTable,U32 targetLog,sortedSymbol_t *sortedList,U32 sortedListSize
                     ,U32 *rankStart,rankValCol_t *rankValOrigin,U32 maxWeight,U32 nbBitsBaseline)

{
  HUF_DEltX2 *pHVar1;
  char cVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint local_ac;
  U32 u;
  U32 end;
  HUF_DEltX2 DElt;
  int minWeight;
  U32 sortedRank;
  U32 length;
  U32 start;
  U32 nbBits;
  U32 weight;
  U16 symbol;
  U32 s;
  U32 minBits;
  int scaleLog;
  U32 rankVal [13];
  rankValCol_t *rankValOrigin_local;
  U32 *rankStart_local;
  U32 sortedListSize_local;
  sortedSymbol_t *sortedList_local;
  U32 targetLog_local;
  HUF_DEltX2 *DTable_local;
  
  memcpy(&minBits,rankValOrigin,0x34);
  for (weight = 0; weight < sortedListSize; weight = weight + 1) {
    uVar3 = (uint)sortedList[weight].weight;
    uVar4 = nbBitsBaseline - uVar3;
    local_ac = (&minBits)[uVar3];
    cVar2 = (char)uVar4;
    iVar5 = 1 << ((char)targetLog - cVar2 & 0x1fU);
    if (targetLog - uVar4 < nbBitsBaseline - maxWeight) {
      MEM_writeLE16(&u,(ushort)sortedList[weight].symbol);
      u = CONCAT13(1,CONCAT12(cVar2,(undefined2)u));
      uVar4 = local_ac + iVar5;
      for (; local_ac < uVar4; local_ac = local_ac + 1) {
        pHVar1 = DTable + local_ac;
        pHVar1->sequence = (undefined2)u;
        pHVar1->nbBits = cVar2;
        pHVar1->length = 1;
      }
    }
    else {
      end = uVar4 + (nbBitsBaseline - targetLog);
      if ((int)end < 1) {
        end = 1;
      }
      DElt = *(HUF_DEltX2 *)(rankStart + (int)end);
      HUF_fillDTableX2Level2
                (DTable + local_ac,targetLog - uVar4,uVar4,rankValOrigin[uVar4],end,
                 sortedList + (uint)DElt,sortedListSize - (int)DElt,nbBitsBaseline,
                 (ushort)sortedList[weight].symbol);
    }
    (&minBits)[uVar3] = iVar5 + (&minBits)[uVar3];
  }
  return;
}

Assistant:

static void HUF_fillDTableX2(HUF_DEltX2* DTable, const U32 targetLog,
                           const sortedSymbol_t* sortedList, const U32 sortedListSize,
                           const U32* rankStart, rankVal_t rankValOrigin, const U32 maxWeight,
                           const U32 nbBitsBaseline)
{
    U32 rankVal[HUF_TABLELOG_MAX + 1];
    const int scaleLog = nbBitsBaseline - targetLog;   /* note : targetLog >= srcLog, hence scaleLog <= 1 */
    const U32 minBits  = nbBitsBaseline - maxWeight;
    U32 s;

    memcpy(rankVal, rankValOrigin, sizeof(rankVal));

    /* fill DTable */
    for (s=0; s<sortedListSize; s++) {
        const U16 symbol = sortedList[s].symbol;
        const U32 weight = sortedList[s].weight;
        const U32 nbBits = nbBitsBaseline - weight;
        const U32 start = rankVal[weight];
        const U32 length = 1 << (targetLog-nbBits);

        if (targetLog-nbBits >= minBits) {   /* enough room for a second symbol */
            U32 sortedRank;
            int minWeight = nbBits + scaleLog;
            if (minWeight < 1) minWeight = 1;
            sortedRank = rankStart[minWeight];
            HUF_fillDTableX2Level2(DTable+start, targetLog-nbBits, nbBits,
                           rankValOrigin[nbBits], minWeight,
                           sortedList+sortedRank, sortedListSize-sortedRank,
                           nbBitsBaseline, symbol);
        } else {
            HUF_DEltX2 DElt;
            MEM_writeLE16(&(DElt.sequence), symbol);
            DElt.nbBits = (BYTE)(nbBits);
            DElt.length = 1;
            {   U32 const end = start + length;
                U32 u;
                for (u = start; u < end; u++) DTable[u] = DElt;
        }   }
        rankVal[weight] += length;
    }
}